

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BasicReporter::streamVariableLengthText(BasicReporter *this,string *prefix,string *text)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  string trimmed;
  string sStack_38;
  
  trim(&sStack_38,text);
  lVar1 = std::__cxx11::string::find_first_of((char *)&sStack_38,0x14e39a);
  poVar2 = (this->m_config).m_stream;
  if (lVar1 == -1) {
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
    pcVar3 = "]";
  }
  else {
    poVar2 = std::operator<<(poVar2,"\n[");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,"] >>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n");
    poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
    poVar2 = std::operator<<(poVar2,"\n[end of ");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    pcVar3 = "] <<<<<<<<<<<<<<<<<<<<<<<<\n";
  }
  std::operator<<(poVar2,pcVar3);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void streamVariableLengthText( const std::string& prefix, const std::string& text ) {
            std::string trimmed = trim( text );
            if( trimmed.find_first_of( "\r\n" ) == std::string::npos ) {
                m_config.stream() << "[" << prefix << ": " << trimmed << "]";
            }
            else {
                m_config.stream() << "\n[" << prefix << "] >>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n" << trimmed
                << "\n[end of " << prefix << "] <<<<<<<<<<<<<<<<<<<<<<<<\n";
            }
        }